

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void __thiscall CConsole::~CConsole(CConsole *this)

{
  long lVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  CChain *pChainInfo;
  void *pUserData;
  FCommandCallback pfnCallback;
  CCommand *pNext;
  CCommand *pCommand;
  long local_28;
  code *local_20;
  long local_10;
  
  *in_RDI = &PTR__CConsole_001851b0;
  local_10 = in_RDI[5];
  while (local_10 != 0) {
    lVar1 = *(long *)(local_10 + 0x28);
    local_20 = *(code **)(local_10 + 0x38);
    local_28 = *(long *)(local_10 + 0x40);
    while (local_20 == Con_Chain) {
      local_20 = *(code **)(local_28 + 8);
      local_28 = *(long *)(local_28 + 0x10);
      mem_free((void *)0x13d7d2);
    }
    mem_free((void *)0x13d7e0);
    local_10 = lVar1;
  }
  if (in_RDI[0x1c] != 0) {
    pvVar2 = (void *)in_RDI[0x1c];
    if (pvVar2 != (void *)0x0) {
      CHeap::~CHeap((CHeap *)0x13d821);
      operator_delete(pvVar2,8);
    }
    in_RDI[0x1c] = 0;
  }
  CExecutionQueue::~CExecutionQueue((CExecutionQueue *)0x13d851);
  CHeap::~CHeap((CHeap *)0x13d85f);
  IConsole::~IConsole((IConsole *)0x13d869);
  return;
}

Assistant:

CConsole::~CConsole()
{
	CCommand *pCommand = m_pFirstCommand;
	while(pCommand)
	{
		CCommand *pNext = pCommand->m_pNext;

		FCommandCallback pfnCallback = pCommand->m_pfnCallback;
		void *pUserData = pCommand->m_pUserData;
		while(pfnCallback == Con_Chain)
		{
			CChain *pChainInfo = static_cast<CChain *>(pUserData);
			pfnCallback = pChainInfo->m_pfnCallback;
			pUserData = pChainInfo->m_pCallbackUserData;
			mem_free(pChainInfo);
		}

		mem_free(pCommand);

		pCommand = pNext;
	}
	if(m_pTempMapListHeap)
	{
		delete m_pTempMapListHeap;
		m_pTempMapListHeap = 0;
	}
}